

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O1

DiskFileToVirtualFileResult __thiscall
google::protobuf::compiler::DiskSourceTree::DiskFileToVirtualFile
          (DiskSourceTree *this,string *disk_file,string *virtual_file,string *shadowing_disk_file)

{
  pointer pcVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  ZeroCopyInputStream *pZVar5;
  pointer pMVar6;
  DiskFileToVirtualFileResult DVar7;
  long lVar8;
  ulong uVar9;
  _Alloc_hider this_00;
  string canonical_disk_file;
  string local_70;
  string local_50;
  
  pcVar1 = (disk_file->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + disk_file->_M_string_length);
  CanonicalizePath(&local_50,&local_70);
  this_00._M_p = local_70._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pMVar6 = (this->mappings_).
           super__Vector_base<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = 0xffffffff;
  if ((this->mappings_).
      super__Vector_base<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
      ._M_impl.super__Vector_impl_data._M_finish != pMVar6) {
    lVar8 = 0;
    uVar9 = 0;
    do {
      this_00._M_p = (pointer)&local_50;
      bVar2 = ApplyMapping((string *)&local_50,
                           (string *)((long)&(pMVar6->disk_path)._M_dataplus._M_p + lVar8),
                           (string *)((long)&(pMVar6->virtual_path)._M_dataplus._M_p + lVar8),
                           virtual_file);
      if (bVar2) {
        uVar3 = (uint)uVar9;
        goto LAB_002cb95a;
      }
      uVar9 = uVar9 + 1;
      pMVar6 = (this->mappings_).
               super__Vector_base<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x40;
    } while (uVar9 < (ulong)((long)(this->mappings_).
                                   super__Vector_base<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar6 >> 6));
    uVar3 = 0xffffffff;
  }
LAB_002cb95a:
  if (uVar3 == 0xffffffff) {
    DVar7 = NO_MAPPING;
  }
  else {
    if (0 < (int)uVar3) {
      lVar8 = 0;
      do {
        pMVar6 = (this->mappings_).
                 super__Vector_base<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        this_00._M_p = (pointer)virtual_file;
        bVar2 = ApplyMapping(virtual_file,
                             (string *)((long)&(pMVar6->virtual_path)._M_dataplus._M_p + lVar8),
                             (string *)((long)&(pMVar6->disk_path)._M_dataplus._M_p + lVar8),
                             shadowing_disk_file);
        if (bVar2) {
          this_00._M_p = (shadowing_disk_file->_M_dataplus)._M_p;
          iVar4 = access(this_00._M_p,0);
          if (-1 < iVar4) {
            DVar7 = SHADOWED;
            goto LAB_002cb9df;
          }
        }
        lVar8 = lVar8 + 0x40;
      } while ((ulong)uVar3 << 6 != lVar8);
    }
    shadowing_disk_file->_M_string_length = 0;
    *(shadowing_disk_file->_M_dataplus)._M_p = '\0';
    pZVar5 = OpenDiskFile((DiskSourceTree *)this_00._M_p,disk_file);
    DVar7 = (uint)(pZVar5 == (ZeroCopyInputStream *)0x0) * 2;
    if (pZVar5 != (ZeroCopyInputStream *)0x0) {
      (*pZVar5->_vptr_ZeroCopyInputStream[1])(pZVar5);
    }
  }
LAB_002cb9df:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return DVar7;
}

Assistant:

DiskSourceTree::DiskFileToVirtualFileResult
DiskSourceTree::DiskFileToVirtualFile(
    const string& disk_file,
    string* virtual_file,
    string* shadowing_disk_file) {
  int mapping_index = -1;
  string canonical_disk_file = CanonicalizePath(disk_file);

  for (int i = 0; i < mappings_.size(); i++) {
    // Apply the mapping in reverse.
    if (ApplyMapping(canonical_disk_file, mappings_[i].disk_path,
                     mappings_[i].virtual_path, virtual_file)) {
      // Success.
      mapping_index = i;
      break;
    }
  }

  if (mapping_index == -1) {
    return NO_MAPPING;
  }

  // Iterate through all mappings with higher precedence and verify that none
  // of them map this file to some other existing file.
  for (int i = 0; i < mapping_index; i++) {
    if (ApplyMapping(*virtual_file, mappings_[i].virtual_path,
                     mappings_[i].disk_path, shadowing_disk_file)) {
      if (access(shadowing_disk_file->c_str(), F_OK) >= 0) {
        // File exists.
        return SHADOWED;
      }
    }
  }
  shadowing_disk_file->clear();

  // Verify that we can open the file.  Note that this also has the side-effect
  // of verifying that we are not canonicalizing away any non-existent
  // directories.
  google::protobuf::scoped_ptr<io::ZeroCopyInputStream> stream(OpenDiskFile(disk_file));
  if (stream == NULL) {
    return CANNOT_OPEN;
  }

  return SUCCESS;
}